

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall
mkvparser::Segment::DoParseNext(Segment *this,Cluster **pResult,longlong *pos,long *len)

{
  Cluster **ppCVar1;
  long lVar2;
  Segment *this_00;
  bool bVar3;
  int iVar4;
  longlong lVar5;
  longlong lVar6;
  ulong uVar7;
  Cues *pCVar8;
  Cluster *pCVar9;
  Cluster **ppCVar10;
  long lVar11;
  long lVar12;
  Cluster **ppCVar13;
  long lVar14;
  Cluster **ppCVar15;
  longlong avail;
  longlong total;
  long len_;
  longlong pos_;
  long local_70;
  Segment *local_68;
  ulong local_60;
  long local_58;
  Cluster **local_50;
  ulong local_48;
  long local_40;
  longlong local_38;
  
  iVar4 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&local_58,&local_70);
  if (iVar4 < 0) {
    return (long)iVar4;
  }
  local_50 = pResult;
  if ((-1 < local_58) && (local_58 < local_70)) {
    __assert_fail("(total < 0) || (avail <= total)",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xb21,
                  "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
  }
  lVar11 = this->m_start + this->m_size;
  if (this->m_size < 0) {
    lVar11 = -1;
  }
  lVar12 = *pos;
  if (local_58 <= lVar12 && -1 < local_58) {
    return 1;
  }
LAB_0010f675:
  if ((-1 < lVar11) && (lVar11 <= lVar12)) {
    return 1;
  }
  if (local_70 <= lVar12) goto LAB_0010fcda;
  lVar5 = GetUIntLength(this->m_pReader,lVar12,len);
  if (lVar5 < 0) {
    return lVar5;
  }
  if (lVar5 != 0) {
    return -3;
  }
  local_68 = (Segment *)*pos;
  if (-1 < lVar11 && lVar11 < *len + (long)local_68) {
    return -2;
  }
  if (local_70 < *len + (long)local_68) {
    return -3;
  }
  local_60 = this->m_start;
  lVar5 = ReadID(this->m_pReader,(longlong)local_68,len);
  if (lVar5 < 0) {
    return lVar5;
  }
  if (lVar5 == 0) {
    return -1;
  }
  lVar12 = *pos + *len;
  *pos = lVar12;
  if (local_70 <= lVar12) {
    *len = 1;
    return -3;
  }
  lVar6 = GetUIntLength(this->m_pReader,lVar12,len);
  if (lVar6 < 0) {
    return lVar6;
  }
  if (lVar6 != 0) {
    return -3;
  }
  lVar12 = *len + *pos;
  if (-1 < lVar11 && lVar11 < lVar12) {
    return -2;
  }
  if (local_70 < lVar12) {
    return -3;
  }
  uVar7 = ReadUInt(this->m_pReader,*pos,len);
  if ((long)uVar7 < 0) {
    return uVar7;
  }
  lVar14 = *len;
  lVar12 = *pos + lVar14;
  *pos = lVar12;
  if (uVar7 == 0) {
LAB_0010f8a6:
    if ((-1 < local_58) && (local_58 <= lVar12)) {
      return 1;
    }
    goto LAB_0010f675;
  }
  local_48 = -1L << ((char)lVar14 * '\a' & 0x3fU) ^ uVar7;
  lVar14 = uVar7 + lVar12;
  if (((-1 < lVar11) && (local_48 != 0xffffffffffffffff)) && (lVar11 < lVar14)) {
    return -2;
  }
  if (lVar5 == 0x1c53bb6b) {
    if (local_48 == 0xffffffffffffffff) {
      return -2;
    }
    if (-1 < lVar11 && lVar11 < lVar14) {
      return -2;
    }
    if (this->m_pCues == (Cues *)0x0) {
      pCVar8 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
      if (pCVar8 == (Cues *)0x0) {
        this->m_pCues = (Cues *)0x0;
        return 0;
      }
      pCVar8->m_pSegment = this;
      pCVar8->m_start = lVar12;
      pCVar8->m_size = uVar7;
      pCVar8->m_element_start = (longlong)local_68;
      pCVar8->m_element_size = lVar14 - (long)local_68;
      pCVar8->m_cue_points = (CuePoint **)0x0;
      pCVar8->m_count = 0;
      pCVar8->m_preload_count = 0;
      pCVar8->m_pos = lVar12;
      this->m_pCues = pCVar8;
    }
    *pos = lVar14;
    lVar12 = lVar14;
    goto LAB_0010f8a6;
  }
  if (lVar5 != 0x1f43b675) {
    if (local_48 == 0xffffffffffffffff) {
      return -2;
    }
    *pos = lVar14;
    lVar12 = lVar14;
    if ((-1 < lVar11) && (lVar11 < lVar14)) {
      return -2;
    }
    goto LAB_0010f8a6;
  }
  lVar12 = (long)local_68 - local_60;
  if (lVar12 == 0 || (long)local_68 < (long)local_60) {
    __assert_fail("off_next > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xba9,
                  "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
  }
  ppCVar13 = this->m_clusters + this->m_clusterCount;
  ppCVar1 = ppCVar13 + this->m_clusterPreloadCount;
  ppCVar10 = ppCVar1;
  ppCVar15 = ppCVar1;
  if (0 < this->m_clusterPreloadCount) {
    do {
      ppCVar15 = (Cluster **)
                 ((long)ppCVar13 +
                 (((long)ppCVar10 - (long)ppCVar13 >> 3) - ((long)ppCVar10 - (long)ppCVar13 >> 0x3f)
                 & 0xfffffffffffffffeU) * 4);
      if (ppCVar1 <= ppCVar15) {
        __assert_fail("k < jj",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xbbe,
                      "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)")
        ;
      }
      pCVar9 = *ppCVar15;
      if (pCVar9 == (Cluster *)0x0) {
        __assert_fail("pNext",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xbc1,
                      "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)")
        ;
      }
      if (-1 < pCVar9->m_index) {
        __assert_fail("pNext->m_index < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xbc2,
                      "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)")
        ;
      }
      lVar14 = pCVar9->m_element_start - pCVar9->m_pSegment->m_start;
      if (lVar14 < 0) {
        __assert_fail("pos >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1adb,"long long mkvparser::Cluster::GetPosition() const");
      }
      *pos = lVar14;
      if (lVar14 < lVar12) {
        ppCVar13 = ppCVar15 + 1;
        ppCVar15 = ppCVar10;
      }
      else if (lVar14 <= lVar12) {
        *local_50 = pCVar9;
        return 0;
      }
      ppCVar10 = ppCVar15;
    } while (ppCVar13 < ppCVar15);
  }
  local_60 = uVar7;
  if (ppCVar13 != ppCVar15) {
    __assert_fail("i == j",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xbd1,
                  "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
  }
  local_68 = this;
  lVar14 = Cluster::HasBlockEntries(this,lVar12,&local_38,&local_40);
  this_00 = local_68;
  if (lVar14 < 0) {
    *pos = local_38;
    *len = local_40;
    return lVar14;
  }
  if (lVar14 != 0) {
    pCVar9 = Cluster::Create(local_68,-1,lVar12);
    if (pCVar9 == (Cluster *)0x0) {
      return -1;
    }
    lVar12 = (long)ppCVar15 - (long)this_00->m_clusters;
    lVar11 = lVar12 >> 3;
    bVar3 = PreloadCluster(this_00,pCVar9,lVar11);
    if (!bVar3) {
      Cluster::~Cluster(pCVar9);
      operator_delete(pCVar9);
      return -1;
    }
    if (this_00->m_clusters == (Cluster **)0x0) {
      __assert_fail("m_clusters",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xbec,
                    "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
    }
    if (this_00->m_clusterSize <= lVar11) {
      __assert_fail("idx_next < m_clusterSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xbed,
                    "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
    }
    if (*(Cluster **)((long)this_00->m_clusters + lVar12) != pCVar9) {
      __assert_fail("m_clusters[idx_next] == pNext",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xbee,
                    "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
    }
    *local_50 = pCVar9;
    return 0;
  }
  lVar12 = *pos;
  if (local_48 != 0xffffffffffffffff) goto LAB_0010fca0;
  lVar14 = lVar12;
  if ((lVar12 < local_58 || local_58 < 0) && (lVar12 < lVar11 || lVar11 < 0)) {
    do {
      if (local_70 <= lVar14) {
LAB_0010fcda:
        *len = 1;
        return -3;
      }
      lVar5 = GetUIntLength(local_68->m_pReader,lVar14,len);
      if (lVar5 < 0) {
        return lVar5;
      }
      if (lVar5 != 0) {
        return -3;
      }
      lVar14 = *len + *pos;
      if (-1 < lVar11 && lVar11 < lVar14) {
        return -2;
      }
      if (local_70 < lVar14) {
        return -3;
      }
      lVar5 = ReadID(local_68->m_pReader,*pos,len);
      if (lVar5 < 0) {
        return lVar5;
      }
      if ((lVar5 == 0x1c53bb6b) || (lVar5 == 0x1f43b675)) goto LAB_0010fc8f;
      lVar14 = *pos + *len;
      *pos = lVar14;
      if (local_70 <= lVar14) {
        *len = 1;
        return -3;
      }
      lVar5 = GetUIntLength(local_68->m_pReader,lVar14,len);
      if (lVar5 < 0) {
        return lVar5;
      }
      if (lVar5 != 0) {
        return -3;
      }
      lVar14 = *len + *pos;
      if (-1 < lVar11 && lVar11 < lVar14) {
        return -2;
      }
      if (local_70 < lVar14) {
        return -3;
      }
      uVar7 = ReadUInt(local_68->m_pReader,*pos,len);
      if ((long)uVar7 < 0) {
        return uVar7;
      }
      lVar2 = *len;
      lVar14 = *pos + lVar2;
      *pos = lVar14;
      if (uVar7 != 0) {
        if ((-1L << ((char)lVar2 * '\a' & 0x3fU) ^ uVar7) == 0xffffffffffffffff) {
          return -2;
        }
        lVar14 = lVar14 + uVar7;
        if ((-1 < lVar11) && (lVar11 < lVar14)) {
          return -2;
        }
        *pos = lVar14;
      }
      if ((local_58 <= lVar14 && -1 < local_58) || (lVar11 <= lVar14 && -1 < lVar11))
      goto LAB_0010fc8f;
    } while( true );
  }
LAB_0010fc92:
  local_60 = lVar14 - lVar12;
  if ((long)local_60 < 0) {
    __assert_fail("cluster_size >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xc53,
                  "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
  }
LAB_0010fca0:
  *pos = lVar12 + local_60;
  return (ulong)((long)(lVar12 + local_60) <= lVar11 || lVar11 < 0) * 4 + -2;
LAB_0010fc8f:
  lVar14 = *pos;
  goto LAB_0010fc92;
}

Assistant:

long Segment::DoParseNext(const Cluster*& pResult, long long& pos, long& len) {
  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  // Parse next cluster.  This is strictly a parsing activity.
  // Creation of a new cluster object happens later, after the
  // parsing is done.

  long long off_next = 0;
  long long cluster_size = -1;

  for (;;) {
    if ((total >= 0) && (pos >= total))
      return 1;  // EOF

    if ((segment_stop >= 0) && (pos >= segment_stop))
      return 1;  // EOF

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long idpos = pos;  // absolute
    const long long idoff = pos - m_start;  // relative

    const long long id = ReadID(m_pReader, idpos, len);  // absolute

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id == 0)  // weird
      return -1;  // generic error

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume length of size of element

    // Pos now points to start of payload

    if (size == 0)  // weird
      continue;

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if ((segment_stop >= 0) && (size != unknown_size) &&
        ((pos + size) > segment_stop)) {
      return E_FILE_FORMAT_INVALID;
    }

    if (id == libwebm::kMkvCues) {
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      const long long element_stop = pos + size;

      if ((segment_stop >= 0) && (element_stop > segment_stop))
        return E_FILE_FORMAT_INVALID;

      const long long element_start = idpos;
      const long long element_size = element_stop - element_start;

      if (m_pCues == NULL) {
        m_pCues = new (std::nothrow)
            Cues(this, pos, size, element_start, element_size);
        if (m_pCues == NULL)
          return false;
      }

      pos += size;  // consume payload
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    if (id != libwebm::kMkvCluster) {  // not a Cluster ID
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      pos += size;  // consume payload
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    // We have a cluster.
    off_next = idoff;

    if (size != unknown_size)
      cluster_size = size;

    break;
  }

  assert(off_next > 0);  // have cluster

  // We have parsed the next cluster.
  // We have not created a cluster object yet.  What we need
  // to do now is determine whether it has already be preloaded
  //(in which case, an object for this cluster has already been
  // created), and if not, create a new cluster object.

  Cluster** const ii = m_clusters + m_clusterCount;
  Cluster** i = ii;

  Cluster** const jj = ii + m_clusterPreloadCount;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[0, i) < pos_next
    //[i, j) ?
    //[j, jj)  > pos_next

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    const Cluster* const pNext = *k;
    assert(pNext);
    assert(pNext->m_index < 0);

    pos = pNext->GetPosition();
    assert(pos >= 0);

    if (pos < off_next)
      i = k + 1;
    else if (pos > off_next)
      j = k;
    else {
      pResult = pNext;
      return 0;  // success
    }
  }

  assert(i == j);

  long long pos_;
  long len_;

  status = Cluster::HasBlockEntries(this, off_next, pos_, len_);

  if (status < 0) {  // error or underflow
    pos = pos_;
    len = len_;

    return status;
  }

  if (status > 0) {  // means "found at least one block entry"
    Cluster* const pNext = Cluster::Create(this,
                                           -1,  // preloaded
                                           off_next);
    if (pNext == NULL)
      return -1;

    const ptrdiff_t idx_next = i - m_clusters;  // insertion position

    if (!PreloadCluster(pNext, idx_next)) {
      delete pNext;
      return -1;
    }
    assert(m_clusters);
    assert(idx_next < m_clusterSize);
    assert(m_clusters[idx_next] == pNext);

    pResult = pNext;
    return 0;  // success
  }

  // status == 0 means "no block entries found"

  if (cluster_size < 0) {  // unknown size
    const long long payload_pos = pos;  // absolute pos of cluster payload

    for (;;) {  // determine cluster size
      if ((total >= 0) && (pos >= total))
        break;

      if ((segment_stop >= 0) && (pos >= segment_stop))
        break;  // no more clusters

      // Read ID

      if ((pos + 1) > avail) {
        len = 1;
        return E_BUFFER_NOT_FULL;
      }

      long long result = GetUIntLength(m_pReader, pos, len);

      if (result < 0)  // error
        return static_cast<long>(result);

      if (result > 0)  // weird
        return E_BUFFER_NOT_FULL;

      if ((segment_stop >= 0) && ((pos + len) > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > avail)
        return E_BUFFER_NOT_FULL;

      const long long idpos = pos;
      const long long id = ReadID(m_pReader, idpos, len);

      if (id < 0)  // error (or underflow)
        return static_cast<long>(id);

      // This is the distinguished set of ID's we use to determine
      // that we have exhausted the sub-element's inside the cluster
      // whose ID we parsed earlier.

      if (id == libwebm::kMkvCluster || id == libwebm::kMkvCues)
        break;

      pos += len;  // consume ID (of sub-element)

      // Read Size

      if ((pos + 1) > avail) {
        len = 1;
        return E_BUFFER_NOT_FULL;
      }

      result = GetUIntLength(m_pReader, pos, len);

      if (result < 0)  // error
        return static_cast<long>(result);

      if (result > 0)  // weird
        return E_BUFFER_NOT_FULL;

      if ((segment_stop >= 0) && ((pos + len) > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > avail)
        return E_BUFFER_NOT_FULL;

      const long long size = ReadUInt(m_pReader, pos, len);

      if (size < 0)  // error
        return static_cast<long>(size);

      pos += len;  // consume size field of element

      // pos now points to start of sub-element's payload

      if (size == 0)  // weird
        continue;

      const long long unknown_size = (1LL << (7 * len)) - 1;

      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;  // not allowed for sub-elements

      if ((segment_stop >= 0) && ((pos + size) > segment_stop))  // weird
        return E_FILE_FORMAT_INVALID;

      pos += size;  // consume payload of sub-element
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;
    }  // determine cluster size

    cluster_size = pos - payload_pos;
    assert(cluster_size >= 0);  // TODO: handle cluster_size = 0

    pos = payload_pos;  // reset and re-parse original cluster
  }

  pos += cluster_size;  // consume payload
  if (segment_stop >= 0 && pos > segment_stop)
    return E_FILE_FORMAT_INVALID;

  return 2;  // try to find a cluster that follows next
}